

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void modwt(wt_object wt,double *inp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  wave_object pwVar6;
  double *pdVar7;
  double *pdVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *__ptr;
  double *pdVar14;
  fft_object obj;
  fft_object obj_00;
  fft_data *inp_00;
  fft_data *oup;
  fft_data *inp_01;
  fft_data *oup_00;
  fft_data *oup_01;
  void *pvVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  char *__s;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  double dVar25;
  double dVar26;
  int local_38;
  
  iVar9 = strcmp(wt->cmethod,"direct");
  if (iVar9 == 0) {
    iVar9 = strcmp(wt->ext,"per");
    if (iVar9 == 0) {
      uVar4 = wt->siglength;
      uVar23 = (ulong)uVar4;
      iVar9 = wt->J;
      lVar17 = (long)iVar9;
      iVar12 = (iVar9 + 1) * uVar4;
      wt->length[lVar17] = uVar4;
      wt->length[0] = uVar4;
      wt->length[lVar17 + 1] = iVar12;
      wt->outlength = iVar12;
      if (1 < lVar17) {
        lVar18 = 0;
        do {
          wt->length[lVar18 + 1] = uVar4;
          lVar18 = lVar18 + 1;
        } while (lVar17 + -1 != lVar18);
      }
      sVar24 = (long)(int)uVar4 * 8;
      pvVar15 = malloc(sVar24);
      __ptr = malloc(sVar24);
      if (0 < (int)uVar4) {
        uVar22 = 0;
        do {
          *(double *)(wt[1].method + uVar22 * 8 + -0x10) = inp[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
      if (0 < iVar9) {
        pwVar6 = wt->wave;
        uVar5 = pwVar6->lpd_len;
        uVar22 = (ulong)uVar5;
        local_38 = 1;
        iVar11 = 0;
        do {
          local_38 = local_38 << (iVar11 != 0);
          pdVar14 = (double *)malloc((long)(int)uVar5 << 4);
          if (0 < (int)uVar5) {
            pdVar7 = pwVar6->lpd;
            pdVar8 = pwVar6->hpd;
            uVar19 = 0;
            do {
              pdVar14[uVar19] = pdVar7[uVar19] / 1.4142135623730951;
              pdVar14[uVar22 + uVar19] = pdVar8[uVar19] / 1.4142135623730951;
              uVar19 = uVar19 + 1;
            } while (uVar22 != uVar19);
          }
          if ((int)uVar4 < 1) {
            free(pdVar14);
          }
          else {
            dVar1 = *pdVar14;
            dVar2 = pdVar14[(int)uVar5];
            uVar19 = 0;
            do {
              dVar25 = *(double *)(wt[1].method + uVar19 * 8 + -0x10);
              dVar26 = dVar1 * dVar25;
              *(double *)((long)pvVar15 + uVar19 * 8) = dVar26;
              dVar25 = dVar25 * dVar2;
              *(double *)((long)__ptr + uVar19 * 8) = dVar25;
              if (1 < (int)uVar5) {
                uVar20 = 1;
                uVar21 = uVar19 & 0xffffffff;
                do {
                  iVar13 = (int)uVar21 + (uVar4 - local_38);
                  do {
                    iVar13 = iVar13 - uVar4;
                  } while ((int)uVar4 <= iVar13);
                  iVar16 = 0;
                  if (0 < iVar13) {
                    iVar16 = iVar13;
                  }
                  uVar10 = (((iVar16 - (uint)(iVar16 != iVar13)) - iVar13) / uVar4 +
                           (uint)(iVar16 != iVar13)) * uVar4 + iVar13;
                  dVar26 = dVar26 + pdVar14[uVar20] *
                                    *(double *)(wt[1].method + (ulong)uVar10 * 8 + -0x10);
                  dVar25 = dVar25 + *(double *)(wt[1].method + (ulong)uVar10 * 8 + -0x10) *
                                    pdVar14[uVar20 + uVar22];
                  uVar20 = uVar20 + 1;
                  uVar21 = (ulong)uVar10;
                } while (uVar20 != uVar22);
                *(double *)((long)pvVar15 + uVar19 * 8) = dVar26;
                *(double *)((long)__ptr + uVar19 * 8) = dVar25;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar23);
            free(pdVar14);
            if (0 < (int)uVar4) {
              uVar19 = 0;
              do {
                *(undefined8 *)(wt[1].method + uVar19 * 8 + -0x10) =
                     *(undefined8 *)((long)pvVar15 + uVar19 * 8);
                *(undefined8 *)
                 ((long)wt + uVar19 * 8 + (long)iVar12 * 8 + (long)(int)uVar4 * -8 + 0x1f8) =
                     *(undefined8 *)((long)__ptr + uVar19 * 8);
                uVar19 = uVar19 + 1;
              } while (uVar23 != uVar19);
            }
          }
          iVar12 = iVar12 - uVar4;
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar9);
      }
      free(pvVar15);
      free(__ptr);
      return;
    }
    puts("MODWT direct method only uses periodic extension per. ");
    __s = " Use MODWT fft method for symmetric extension sym ";
  }
  else {
    iVar9 = strcmp(wt->cmethod,"fft");
    if (iVar9 == 0) {
      uVar4 = wt->siglength;
      uVar5 = wt->wave->lpd_len;
      iVar9 = strcmp(wt->ext,"sym");
      if (iVar9 == 0) {
        uVar10 = uVar4 * 2;
      }
      else {
        strcmp(wt->ext,"per");
        uVar10 = uVar4;
      }
      iVar9 = wt->J;
      lVar17 = (long)iVar9;
      iVar12 = (iVar9 + 1) * uVar10;
      wt->modwtsiglength = uVar10;
      wt->length[lVar17] = uVar10;
      wt->length[0] = uVar10;
      wt->length[lVar17 + 1] = iVar12;
      wt->outlength = iVar12;
      if (1 < lVar17) {
        lVar18 = 0;
        do {
          wt->length[lVar18 + 1] = uVar10;
          lVar18 = lVar18 + 1;
        } while (lVar17 + -1 != lVar18);
      }
      obj = fft_init(uVar10,1);
      obj_00 = fft_init(uVar10,-1);
      lVar17 = (long)(int)uVar10;
      sVar24 = lVar17 << 4;
      inp_00 = (fft_data *)malloc(sVar24);
      oup = (fft_data *)malloc(sVar24);
      inp_01 = (fft_data *)malloc(sVar24);
      oup_00 = (fft_data *)malloc(sVar24);
      oup_01 = (fft_data *)malloc(sVar24);
      pvVar15 = malloc(lVar17 * 4);
      if (0 < (int)uVar5) {
        pdVar14 = wt->wave->lpd;
        lVar18 = 0;
        do {
          *(double *)((long)&inp_00->re + lVar18 * 2) =
               *(double *)((long)pdVar14 + lVar18) / 1.4142135623730951;
          *(undefined8 *)((long)&inp_00->im + lVar18 * 2) = 0;
          lVar18 = lVar18 + 8;
        } while ((ulong)uVar5 * 8 - lVar18 != 0);
      }
      if ((int)uVar5 < (int)uVar10) {
        memset(inp_00 + (int)uVar5,0,(ulong)(~uVar5 + uVar10) * 0x10 + 0x10);
      }
      fft_exec(obj,inp_00,oup_00);
      if (0 < (int)uVar5) {
        pdVar14 = wt->wave->hpd;
        lVar18 = 0;
        do {
          *(double *)((long)&inp_00->re + lVar18 * 2) =
               *(double *)((long)pdVar14 + lVar18) / 1.4142135623730951;
          *(undefined8 *)((long)&inp_00->im + lVar18 * 2) = 0;
          lVar18 = lVar18 + 8;
        } while ((ulong)uVar5 << 3 != lVar18);
      }
      if ((int)uVar5 < (int)uVar10) {
        memset(inp_00 + (int)uVar5,0,(ulong)(~uVar5 + uVar10) * 0x10 + 0x10);
      }
      fft_exec(obj,inp_00,oup_01);
      if (0 < (int)uVar4) {
        lVar18 = 0;
        do {
          *(undefined8 *)((long)&inp_00->re + lVar18 * 2) = *(undefined8 *)((long)inp + lVar18);
          *(undefined8 *)((long)&inp_00->im + lVar18 * 2) = 0;
          lVar18 = lVar18 + 8;
        } while ((ulong)uVar4 * 8 - lVar18 != 0);
      }
      if ((int)uVar4 < (int)uVar10) {
        lVar18 = lVar17 - (int)uVar4;
        pdVar14 = &inp_00[(int)uVar4].im;
        iVar12 = ~uVar4 + uVar10;
        do {
          ((fft_data *)(pdVar14 + -1))->re = inp[iVar12];
          *pdVar14 = 0.0;
          pdVar14 = pdVar14 + 2;
          iVar12 = iVar12 + -1;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      uVar23 = (ulong)uVar10;
      fft_exec(obj,inp_00,oup);
      if (0 < iVar9) {
        iVar12 = wt->outlength;
        iVar11 = 1;
        iVar13 = 0;
        do {
          if ((int)uVar10 < 1) {
LAB_0010876c:
            fft_exec(obj_00,inp_01,inp_00);
          }
          else {
            iVar16 = 0;
            uVar22 = 0;
            do {
              *(int *)((long)pvVar15 + uVar22 * 4) = iVar16 % (int)uVar10;
              uVar22 = uVar22 + 1;
              iVar16 = iVar16 + iVar11;
            } while (uVar23 != uVar22);
            if ((int)uVar10 < 1) goto LAB_0010876c;
            lVar18 = 0;
            do {
              dVar1 = *(double *)((long)&oup->re + lVar18 * 4);
              dVar2 = *(double *)((long)&oup->im + lVar18 * 4);
              iVar16 = *(int *)((long)pvVar15 + lVar18);
              dVar25 = oup_00[iVar16].re;
              dVar26 = oup_00[iVar16].im;
              dVar3 = oup_01[iVar16].re;
              *(double *)((long)&oup->re + lVar18 * 4) = dVar25 * dVar1 - dVar2 * dVar26;
              *(double *)((long)&oup->im + lVar18 * 4) = dVar25 * dVar2 + dVar26 * dVar1;
              dVar25 = oup_01[iVar16].im;
              *(double *)((long)&inp_01->re + lVar18 * 4) = dVar3 * dVar1 - dVar2 * dVar25;
              *(double *)((long)&inp_01->im + lVar18 * 4) = dVar3 * dVar2 + dVar1 * dVar25;
              lVar18 = lVar18 + 4;
            } while (uVar23 * 4 != lVar18);
            fft_exec(obj_00,inp_01,inp_00);
            if (0 < (int)uVar10) {
              lVar18 = 0;
              do {
                *(double *)((long)wt + lVar18 + (long)iVar12 * 8 + lVar17 * -8 + 0x1f8) =
                     *(double *)((long)&inp_00->re + lVar18 * 2) / (double)(int)uVar10;
                lVar18 = lVar18 + 8;
              } while (uVar23 * 8 != lVar18);
            }
          }
          iVar12 = iVar12 - uVar10;
          iVar11 = iVar11 * 2;
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar9);
      }
      fft_exec(obj_00,oup,inp_00);
      if (0 < (int)uVar10) {
        lVar17 = 0;
        do {
          *(double *)(wt[1].method + lVar17 + -0x10) =
               *(double *)((long)&inp_00->re + lVar17 * 2) / (double)(int)uVar10;
          lVar17 = lVar17 + 8;
        } while (uVar23 << 3 != lVar17);
      }
      free(inp_00);
      free(oup);
      free(inp_01);
      free(oup_00);
      free(oup_01);
      free_fft(obj);
      free_fft(obj_00);
      return;
    }
    __s = "Error- Available Choices for this method are - direct and fft ";
  }
  puts(__s);
  exit(-1);
}

Assistant:

void modwt(wt_object wt, const double *inp) {
	if (!strcmp(wt->cmethod, "direct")) {
		modwt_direct(wt, inp);
	}
	else if (!strcmp(wt->cmethod, "fft")) {
		modwt_fft(wt, inp);
	}
	else {
		printf("Error- Available Choices for this method are - direct and fft \n");
		exit(-1);
	}
}